

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O1

DS_STATUS ds_list_prepend(DsList *list,void *data)

{
  DsListEntry *pDVar1;
  DS_STATUS DVar2;
  DsListEntry *pDVar3;
  DsList *pDVar4;
  DsList *pDVar5;
  
  if (list != (DsList *)0x0) {
    pDVar3 = (DsListEntry *)malloc(0x18);
    if (pDVar3 == (DsListEntry *)0x0) {
      DVar2 = DS_STATUS_OUTMEM;
    }
    else {
      pDVar3->data = data;
      pDVar3->next = (DsListEntry *)0x0;
      pDVar3->prev = (DsListEntry *)0x0;
      pDVar1 = list->entry;
      pDVar4 = list;
      if (pDVar1 != (DsListEntry *)0x0) {
        pDVar3->next = pDVar1;
        pDVar4 = (DsList *)&pDVar1->prev;
        pDVar3->prev = pDVar1->prev;
        pDVar5 = (DsList *)&pDVar1->prev->next;
        if (pDVar1->prev == (DsListEntry *)0x0) {
          pDVar5 = list;
        }
        pDVar5->entry = pDVar3;
      }
      pDVar4->entry = pDVar3;
      list->size = list->size + 1;
      DVar2 = DS_STATUS_OK;
    }
    return DVar2;
  }
  return DS_STATUS_NULL;
}

Assistant:

DS_STATUS ds_list_prepend(DsList *list, void *data)
{
    if (NULL == list)
        return DS_STATUS_NULL;
    DsListEntry *in = (DsListEntry *)malloc(sizeof(DsListEntry));
    if (NULL == in)
        return DS_STATUS_OUTMEM;
    in->data = data;
    in->prev = NULL;
    in->next = NULL;

    DsListEntry **entry = &list->entry;
    if (DS_STATUS_OK != ds_entry_prepend(entry, in))
    {
        free(in);
        return DS_STATUS_NULL;
    }

    (list->size)++;
    return DS_STATUS_OK;
}